

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  uint uVar5;
  BVH *bvh;
  NodeRef root;
  ulong uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  GridSOA *pGVar22;
  uint uVar23;
  int iVar24;
  undefined4 uVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  GridSOA *pGVar33;
  ulong uVar34;
  NodeRef *pNVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar58;
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 extraout_var [56];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar154;
  float fVar162;
  float fVar163;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  undefined1 auVar172 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar173 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [64];
  float fVar186;
  float fVar191;
  undefined1 auVar187 [16];
  float fVar189;
  float fVar190;
  undefined1 in_ZMM14 [64];
  undefined1 auVar188 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  GridSOA *local_1b30;
  undefined1 local_1af8 [16];
  Intersectors *local_1ae0;
  GridSOA *local_1ad8;
  GridSOA *local_1ad0;
  GridSOA *local_1ac8;
  GridSOA *local_1ac0;
  undefined1 local_1ab8 [16];
  undefined1 local_1aa8 [16];
  vbool<4> terminated;
  long local_1a88;
  GridSOA *local_1a80;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a28 [8];
  float fStack_1a20;
  float fStack_1a1c;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  uint local_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  uint uStack_1908;
  uint uStack_1904;
  uint uStack_1900;
  uint uStack_18fc;
  TravRayK<4,_true> tray;
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [8];
  float fStack_17a0;
  float fStack_179c;
  undefined1 local_1798 [8];
  float fStack_1790;
  float fStack_178c;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [8];
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [8];
  float fStack_1720;
  float fStack_171c;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar177 [16];
  
  auVar13 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar100 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar75 = vpcmpeqd_avx(auVar100,(undefined1  [16])valid_i->field_0);
    auVar78 = ZEXT816(0) << 0x40;
    auVar79 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar78,5);
    auVar52 = auVar75 & auVar79;
    if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar52[0xf] < '\0')
    {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      auVar79 = vandps_avx(auVar79,auVar75);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar177._8_4_ = 0x7fffffff;
      auVar177._0_8_ = 0x7fffffff7fffffff;
      auVar177._12_4_ = 0x7fffffff;
      auVar179 = ZEXT1664(auVar177);
      auVar75 = vandps_avx(auVar177,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar165._8_4_ = 0x219392ef;
      auVar165._0_8_ = 0x219392ef219392ef;
      auVar165._12_4_ = 0x219392ef;
      auVar52 = vcmpps_avx(auVar75,auVar165,1);
      auVar180._8_4_ = 0x3f800000;
      auVar180._0_8_ = &DAT_3f8000003f800000;
      auVar180._12_4_ = 0x3f800000;
      auVar136 = vdivps_avx(auVar180,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar75 = vandps_avx(auVar177,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vcmpps_avx(auVar75,auVar165,1);
      auVar61 = vdivps_avx(auVar180,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar75 = vandps_avx(auVar177,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar75 = vcmpps_avx(auVar75,auVar165,1);
      auVar137 = vdivps_avx(auVar180,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar161._8_4_ = 0x5d5e0b6b;
      auVar161._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar161._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar136,auVar161,auVar52)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar61,auVar161,auVar53);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar137,auVar161,auVar75)
      ;
      auVar75 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar78,1);
      auVar136._8_4_ = 0x10;
      auVar136._0_8_ = 0x1000000010;
      auVar136._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar75,auVar136);
      auVar75 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar78,5);
      auVar52._8_4_ = 0x20;
      auVar52._0_8_ = 0x2000000020;
      auVar52._12_4_ = 0x20;
      auVar61._8_4_ = 0x30;
      auVar61._0_8_ = 0x3000000030;
      auVar61._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar61,auVar52,auVar75);
      auVar75 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar78,5);
      auVar53._8_4_ = 0x40;
      auVar53._0_8_ = 0x4000000040;
      auVar53._12_4_ = 0x40;
      auVar137._8_4_ = 0x50;
      auVar137._0_8_ = 0x5000000050;
      auVar137._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar137,auVar53,auVar75)
      ;
      auVar75 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar78);
      auVar52 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar78);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar183 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar75,auVar79);
      auVar75._8_4_ = 0xff800000;
      auVar75._0_8_ = 0xff800000ff800000;
      auVar75._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar75,auVar52,auVar79);
      terminated.field_0.i[1] = auVar79._4_4_ ^ auVar100._4_4_;
      terminated.field_0.i[0] = auVar79._0_4_ ^ auVar100._0_4_;
      terminated.field_0.i[2] = auVar79._8_4_ ^ auVar100._8_4_;
      terminated.field_0.i[3] = auVar79._12_4_ ^ auVar100._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar100 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
      auVar188 = ZEXT1664(auVar100);
      local_1ae0 = This;
LAB_0054d724:
      paVar32 = paVar32 + -1;
      root.ptr = pNVar35[-1].ptr;
      pNVar35 = pNVar35 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0054ebb2;
      aVar58 = *paVar32;
      auVar100 = vcmpps_avx((undefined1  [16])aVar58,(undefined1  [16])tray.tfar.field_0,1);
      uVar23 = vmovmskps_avx(auVar100);
      if (uVar23 == 0) {
LAB_0054ebc3:
        iVar24 = 2;
      }
      else {
        uVar34 = (ulong)(uVar23 & 0xff);
        uVar23 = POPCOUNT(uVar23 & 0xff);
        iVar24 = 0;
        if (uVar23 <= uVar31) {
          do {
            sVar27 = 0;
            for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar27 = sVar27 + 1;
            }
            auVar188 = ZEXT1664(auVar188._0_16_);
            bVar36 = occluded1(local_1ae0,bvh,root,sVar27,&pre,ray,&tray,context);
            if (bVar36) {
              terminated.field_0.i[sVar27] = -1;
            }
            uVar34 = uVar34 - 1 & uVar34;
          } while (uVar34 != 0);
          auVar100 = vpcmpeqd_avx(auVar188._0_16_,auVar188._0_16_);
          auVar188 = ZEXT1664(auVar100);
          auVar100 = auVar100 & ~(undefined1  [16])terminated.field_0;
          iVar24 = 3;
          auVar179 = ZEXT1664(auVar179._0_16_);
          auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar100[0xf] < '\0') {
            auVar100._8_4_ = 0xff800000;
            auVar100._0_8_ = 0xff800000ff800000;
            auVar100._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar100,
                               (undefined1  [16])terminated.field_0);
            iVar24 = 2;
          }
        }
        pGVar22 = pre.super_Precalculations.grid;
        if (uVar31 < uVar23) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0054ebb2;
              auVar100 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar58,6);
              if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar100[0xf]) goto LAB_0054ebc3;
              if (((uint)root.ptr & 0xf) != 8) {
                pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                sVar27 = *(size_t *)
                          (pre.super_Precalculations.grid +
                          (ulong)*(uint *)(pre.super_Precalculations.grid + 0x2c) + 0x30);
                auVar100 = auVar13;
                goto LAB_0054eb4d;
              }
              auVar194 = ZEXT1664(auVar188._0_16_ ^ (undefined1  [16])terminated.field_0);
              uVar34 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
              uVar26 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
              iVar24 = *(int *)(pre.super_Precalculations.grid + 0x10);
              lVar3 = uVar26 * 4;
              lVar28 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24) + (root.ptr >> 4) * 4
              ;
              lVar30 = uVar34 * 0xc + lVar28;
              local_1ad8 = pre.super_Precalculations.grid + lVar30 + uVar26 * 4 + 0x2c;
              lVar29 = lVar28 + uVar34 * 8;
              local_1ac0 = pre.super_Precalculations.grid + lVar29 + uVar26 * 4 + 0x30;
              lVar2 = lVar28 + uVar34 * 4;
              local_1ac8 = pre.super_Precalculations.grid + lVar2 + uVar26 * 4 + 0x30;
              local_1ad0 = pre.super_Precalculations.grid + lVar28 + uVar26 * 4 + 0x30;
              local_1b30 = pre.super_Precalculations.grid + lVar30 + 0x30;
              local_1a80 = pre.super_Precalculations.grid + lVar29 + 0x30;
              pGVar33 = pre.super_Precalculations.grid + lVar2 + 0x30;
              lVar28 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24) + 0x2c +
                       (root.ptr >> 4) * 4;
              local_1a88 = 0;
              auVar100 = auVar179._0_16_;
              goto LAB_0054da3e;
            }
            auVar194 = ZEXT1664(auVar183._0_16_);
            uVar34 = 0;
            uVar26 = 8;
            do {
              uVar6 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar34 * 8);
              if (uVar6 != 8) {
                uVar25 = *(undefined4 *)(root.ptr + 0x20 + uVar34 * 4);
                auVar37._4_4_ = uVar25;
                auVar37._0_4_ = uVar25;
                auVar37._8_4_ = uVar25;
                auVar37._12_4_ = uVar25;
                auVar18._8_8_ = tray.org.field_0._8_8_;
                auVar18._0_8_ = tray.org.field_0._0_8_;
                auVar19._8_8_ = tray.org.field_0._24_8_;
                auVar19._0_8_ = tray.org.field_0._16_8_;
                auVar20._8_8_ = tray.org.field_0._40_8_;
                auVar20._0_8_ = tray.org.field_0._32_8_;
                auVar100 = vsubps_avx(auVar37,auVar18);
                auVar125._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar100._0_4_;
                auVar125._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar100._4_4_;
                auVar125._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar100._8_4_;
                auVar125._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar100._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x40 + uVar34 * 4);
                auVar38._4_4_ = uVar25;
                auVar38._0_4_ = uVar25;
                auVar38._8_4_ = uVar25;
                auVar38._12_4_ = uVar25;
                auVar100 = vsubps_avx(auVar38,auVar19);
                auVar147._0_4_ = tray.rdir.field_0._16_4_ * auVar100._0_4_;
                auVar147._4_4_ = tray.rdir.field_0._20_4_ * auVar100._4_4_;
                auVar147._8_4_ = tray.rdir.field_0._24_4_ * auVar100._8_4_;
                auVar147._12_4_ = tray.rdir.field_0._28_4_ * auVar100._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x60 + uVar34 * 4);
                auVar39._4_4_ = uVar25;
                auVar39._0_4_ = uVar25;
                auVar39._8_4_ = uVar25;
                auVar39._12_4_ = uVar25;
                auVar100 = vsubps_avx(auVar39,auVar20);
                auVar166._0_4_ = tray.rdir.field_0._32_4_ * auVar100._0_4_;
                auVar166._4_4_ = tray.rdir.field_0._36_4_ * auVar100._4_4_;
                auVar166._8_4_ = tray.rdir.field_0._40_4_ * auVar100._8_4_;
                auVar166._12_4_ = tray.rdir.field_0._44_4_ * auVar100._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x30 + uVar34 * 4);
                auVar40._4_4_ = uVar25;
                auVar40._0_4_ = uVar25;
                auVar40._8_4_ = uVar25;
                auVar40._12_4_ = uVar25;
                auVar100 = vsubps_avx(auVar40,auVar18);
                auVar59._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar100._0_4_;
                auVar59._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar100._4_4_;
                auVar59._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar100._8_4_;
                auVar59._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar100._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x50 + uVar34 * 4);
                auVar41._4_4_ = uVar25;
                auVar41._0_4_ = uVar25;
                auVar41._8_4_ = uVar25;
                auVar41._12_4_ = uVar25;
                auVar100 = vsubps_avx(auVar41,auVar19);
                auVar80._0_4_ = tray.rdir.field_0._16_4_ * auVar100._0_4_;
                auVar80._4_4_ = tray.rdir.field_0._20_4_ * auVar100._4_4_;
                auVar80._8_4_ = tray.rdir.field_0._24_4_ * auVar100._8_4_;
                auVar80._12_4_ = tray.rdir.field_0._28_4_ * auVar100._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x70 + uVar34 * 4);
                auVar42._4_4_ = uVar25;
                auVar42._0_4_ = uVar25;
                auVar42._8_4_ = uVar25;
                auVar42._12_4_ = uVar25;
                auVar100 = vsubps_avx(auVar42,auVar20);
                auVar101._0_4_ = tray.rdir.field_0._32_4_ * auVar100._0_4_;
                auVar101._4_4_ = tray.rdir.field_0._36_4_ * auVar100._4_4_;
                auVar101._8_4_ = tray.rdir.field_0._40_4_ * auVar100._8_4_;
                auVar101._12_4_ = tray.rdir.field_0._44_4_ * auVar100._12_4_;
                auVar100 = vminps_avx(auVar125,auVar59);
                auVar75 = vminps_avx(auVar147,auVar80);
                auVar100 = vmaxps_avx(auVar100,auVar75);
                auVar75 = vminps_avx(auVar166,auVar101);
                auVar100 = vmaxps_avx(auVar100,auVar75);
                auVar43._0_4_ = auVar173._0_4_ * auVar100._0_4_;
                auVar43._4_4_ = auVar173._4_4_ * auVar100._4_4_;
                auVar43._8_4_ = auVar173._8_4_ * auVar100._8_4_;
                auVar43._12_4_ = auVar173._12_4_ * auVar100._12_4_;
                auVar100 = vmaxps_avx(auVar125,auVar59);
                auVar75 = vmaxps_avx(auVar147,auVar80);
                auVar75 = vminps_avx(auVar100,auVar75);
                auVar100 = vmaxps_avx(auVar166,auVar101);
                auVar100 = vminps_avx(auVar75,auVar100);
                auVar60._0_4_ = auVar185._0_4_ * auVar100._0_4_;
                auVar60._4_4_ = auVar185._4_4_ * auVar100._4_4_;
                auVar60._8_4_ = auVar185._8_4_ * auVar100._8_4_;
                auVar60._12_4_ = auVar185._12_4_ * auVar100._12_4_;
                auVar100 = vmaxps_avx(auVar43,(undefined1  [16])tray.tnear.field_0);
                auVar75 = vminps_avx(auVar60,(undefined1  [16])tray.tfar.field_0);
                auVar100 = vcmpps_avx(auVar100,auVar75,2);
                if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar100[0xf] < '\0') {
                  auVar100 = vblendvps_avx(auVar183._0_16_,auVar43,auVar100);
                  if (uVar26 != 8) {
                    pNVar35->ptr = uVar26;
                    pNVar35 = pNVar35 + 1;
                    *paVar32 = auVar194._0_16_;
                    paVar32 = paVar32 + 1;
                  }
                  auVar194 = ZEXT1664(auVar100);
                  uVar26 = uVar6;
                }
              }
              aVar58 = auVar194._0_16_;
            } while ((uVar6 != 8) && (bVar36 = uVar34 < 3, uVar34 = uVar34 + 1, bVar36));
            iVar24 = 0;
            if (uVar26 == 8) {
LAB_0054d906:
              bVar36 = false;
              iVar24 = 4;
            }
            else {
              auVar100 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar58,6);
              uVar25 = vmovmskps_avx(auVar100);
              bVar36 = true;
              if ((uint)POPCOUNT(uVar25) <= uVar31) {
                pNVar35->ptr = uVar26;
                pNVar35 = pNVar35 + 1;
                *paVar32 = aVar58;
                paVar32 = paVar32 + 1;
                goto LAB_0054d906;
              }
            }
            root.ptr = uVar26;
          } while (bVar36);
        }
      }
      goto LAB_0054ebb5;
    }
  }
  return;
  while( true ) {
    local_1ad8 = local_1ad8 + lVar3;
    local_1ac0 = local_1ac0 + lVar3;
    local_1ac8 = local_1ac8 + lVar3;
    local_1ad0 = local_1ad0 + lVar3;
    local_1b30 = local_1b30 + lVar3;
    local_1a80 = local_1a80 + lVar3;
    pGVar33 = pGVar33 + lVar3;
    lVar28 = lVar28 + lVar3;
    bVar36 = local_1a88 != 0;
    local_1a88 = local_1a88 + 1;
    if (bVar36) break;
LAB_0054da3e:
    lVar29 = 0;
    do {
      if ((ulong)(uVar26 != 2) * 4 + 4 == lVar29) break;
      uVar25 = *(undefined4 *)(pGVar22 + lVar29 + lVar28);
      auVar44._4_4_ = uVar25;
      auVar44._0_4_ = uVar25;
      auVar44._8_4_ = uVar25;
      auVar44._12_4_ = uVar25;
      auVar61 = auVar194._0_16_;
      uVar25 = *(undefined4 *)(pGVar33 + lVar29 + -4);
      auVar62._4_4_ = uVar25;
      auVar62._0_4_ = uVar25;
      auVar62._8_4_ = uVar25;
      auVar62._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(local_1a80 + lVar29 + -4);
      auVar81._4_4_ = uVar25;
      auVar81._0_4_ = uVar25;
      auVar81._8_4_ = uVar25;
      auVar81._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(local_1ad0 + lVar29 + -4);
      auVar170._4_4_ = uVar25;
      auVar170._0_4_ = uVar25;
      auVar170._8_4_ = uVar25;
      auVar170._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(local_1ac8 + lVar29 + -4);
      auVar102._4_4_ = uVar25;
      auVar102._0_4_ = uVar25;
      auVar102._8_4_ = uVar25;
      auVar102._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(local_1ac0 + lVar29 + -4);
      auVar126._4_4_ = uVar25;
      auVar126._0_4_ = uVar25;
      auVar126._8_4_ = uVar25;
      auVar126._12_4_ = uVar25;
      auVar75 = *(undefined1 (*) [16])ray;
      auVar52 = *(undefined1 (*) [16])(ray + 0x10);
      auVar78 = *(undefined1 (*) [16])(ray + 0x20);
      auVar137 = vsubps_avx(auVar44,auVar75);
      auVar165 = vsubps_avx(auVar62,auVar52);
      local_1ab8 = vsubps_avx(auVar81,auVar78);
      auVar161 = vsubps_avx(auVar102,auVar52);
      auVar177 = vsubps_avx(auVar126,auVar78);
      auVar180 = vsubps_avx(auVar161,auVar165);
      auVar44 = vsubps_avx(auVar177,local_1ab8);
      auVar103._0_4_ = auVar161._0_4_ + auVar165._0_4_;
      auVar103._4_4_ = auVar161._4_4_ + auVar165._4_4_;
      auVar103._8_4_ = auVar161._8_4_ + auVar165._8_4_;
      auVar103._12_4_ = auVar161._12_4_ + auVar165._12_4_;
      fVar9 = local_1ab8._0_4_;
      auVar155._0_4_ = auVar177._0_4_ + fVar9;
      fVar10 = local_1ab8._4_4_;
      auVar155._4_4_ = auVar177._4_4_ + fVar10;
      fVar11 = local_1ab8._8_4_;
      auVar155._8_4_ = auVar177._8_4_ + fVar11;
      fVar12 = local_1ab8._12_4_;
      auVar155._12_4_ = auVar177._12_4_ + fVar12;
      auVar184._0_4_ = auVar103._0_4_ * auVar44._0_4_;
      auVar184._4_4_ = auVar103._4_4_ * auVar44._4_4_;
      auVar184._8_4_ = auVar103._8_4_ * auVar44._8_4_;
      auVar184._12_4_ = auVar103._12_4_ * auVar44._12_4_;
      auVar184 = vfmsub231ps_fma(auVar184,auVar180,auVar155);
      auVar62 = vsubps_avx(auVar170,auVar75);
      auVar81 = vsubps_avx(auVar62,auVar137);
      auVar171._0_4_ = auVar155._0_4_ * auVar81._0_4_;
      auVar171._4_4_ = auVar155._4_4_ * auVar81._4_4_;
      auVar171._8_4_ = auVar155._8_4_ * auVar81._8_4_;
      auVar171._12_4_ = auVar155._12_4_ * auVar81._12_4_;
      auVar156._0_4_ = auVar62._0_4_ + auVar137._0_4_;
      auVar156._4_4_ = auVar62._4_4_ + auVar137._4_4_;
      auVar156._8_4_ = auVar62._8_4_ + auVar137._8_4_;
      auVar156._12_4_ = auVar62._12_4_ + auVar137._12_4_;
      auVar136 = vfmsub231ps_fma(auVar171,auVar44,auVar156);
      auVar157._0_4_ = auVar156._0_4_ * auVar180._0_4_;
      auVar157._4_4_ = auVar156._4_4_ * auVar180._4_4_;
      auVar157._8_4_ = auVar156._8_4_ * auVar180._8_4_;
      auVar157._12_4_ = auVar156._12_4_ * auVar180._12_4_;
      auVar53 = vfmsub231ps_fma(auVar157,auVar81,auVar103);
      fVar154 = *(float *)(ray + 0x60);
      fVar162 = *(float *)(ray + 100);
      fVar163 = *(float *)(ray + 0x68);
      auVar21 = *(undefined1 (*) [12])(ray + 0x60);
      fVar164 = *(float *)(ray + 0x6c);
      auVar104._0_4_ = auVar53._0_4_ * fVar154;
      auVar104._4_4_ = auVar53._4_4_ * fVar162;
      auVar104._8_4_ = auVar53._8_4_ * fVar163;
      auVar104._12_4_ = auVar53._12_4_ * fVar164;
      auVar53 = *(undefined1 (*) [16])(ray + 0x50);
      auVar103 = vfmadd231ps_fma(auVar104,auVar53,auVar136);
      auVar136 = *(undefined1 (*) [16])(ray + 0x40);
      auVar155 = vfmadd231ps_fma(auVar103,auVar136,auVar184);
      uVar25 = *(undefined4 *)(pGVar22 + lVar29 + lVar28 + 4);
      auVar45._4_4_ = uVar25;
      auVar45._0_4_ = uVar25;
      auVar45._8_4_ = uVar25;
      auVar45._12_4_ = uVar25;
      auVar75 = vsubps_avx(auVar45,auVar75);
      uVar25 = *(undefined4 *)(pGVar33 + lVar29);
      auVar63._4_4_ = uVar25;
      auVar63._0_4_ = uVar25;
      auVar63._8_4_ = uVar25;
      auVar63._12_4_ = uVar25;
      auVar52 = vsubps_avx(auVar63,auVar52);
      uVar25 = *(undefined4 *)(local_1a80 + lVar29);
      auVar112._4_4_ = uVar25;
      auVar112._0_4_ = uVar25;
      auVar112._8_4_ = uVar25;
      auVar112._12_4_ = uVar25;
      auVar78 = vsubps_avx(auVar112,auVar78);
      auVar103 = vsubps_avx(auVar165,auVar52);
      auVar184 = vsubps_avx(local_1ab8,auVar78);
      auVar148._0_4_ = auVar165._0_4_ + auVar52._0_4_;
      auVar148._4_4_ = auVar165._4_4_ + auVar52._4_4_;
      auVar148._8_4_ = auVar165._8_4_ + auVar52._8_4_;
      auVar148._12_4_ = auVar165._12_4_ + auVar52._12_4_;
      auVar181._0_4_ = fVar9 + auVar78._0_4_;
      auVar181._4_4_ = fVar10 + auVar78._4_4_;
      auVar181._8_4_ = fVar11 + auVar78._8_4_;
      auVar181._12_4_ = fVar12 + auVar78._12_4_;
      fVar186 = auVar184._0_4_;
      auVar127._0_4_ = fVar186 * auVar148._0_4_;
      fVar189 = auVar184._4_4_;
      auVar127._4_4_ = fVar189 * auVar148._4_4_;
      fVar190 = auVar184._8_4_;
      auVar127._8_4_ = fVar190 * auVar148._8_4_;
      fVar191 = auVar184._12_4_;
      auVar127._12_4_ = fVar191 * auVar148._12_4_;
      auVar156 = vfmsub231ps_fma(auVar127,auVar103,auVar181);
      auVar104 = vsubps_avx(auVar137,auVar75);
      fVar14 = auVar104._0_4_;
      auVar182._0_4_ = auVar181._0_4_ * fVar14;
      fVar15 = auVar104._4_4_;
      auVar182._4_4_ = auVar181._4_4_ * fVar15;
      fVar16 = auVar104._8_4_;
      auVar182._8_4_ = auVar181._8_4_ * fVar16;
      fVar17 = auVar104._12_4_;
      auVar182._12_4_ = auVar181._12_4_ * fVar17;
      auVar138._0_4_ = auVar137._0_4_ + auVar75._0_4_;
      auVar138._4_4_ = auVar137._4_4_ + auVar75._4_4_;
      auVar138._8_4_ = auVar137._8_4_ + auVar75._8_4_;
      auVar138._12_4_ = auVar137._12_4_ + auVar75._12_4_;
      auVar127 = vfmsub231ps_fma(auVar182,auVar184,auVar138);
      fVar169 = auVar103._0_4_;
      auVar139._0_4_ = fVar169 * auVar138._0_4_;
      fVar174 = auVar103._4_4_;
      auVar139._4_4_ = fVar174 * auVar138._4_4_;
      fVar175 = auVar103._8_4_;
      auVar139._8_4_ = fVar175 * auVar138._8_4_;
      fVar176 = auVar103._12_4_;
      auVar139._12_4_ = fVar176 * auVar138._12_4_;
      auVar46 = vfmsub231ps_fma(auVar139,auVar104,auVar148);
      auVar149._0_4_ = fVar154 * auVar46._0_4_;
      auVar149._4_4_ = fVar162 * auVar46._4_4_;
      auVar149._8_4_ = fVar163 * auVar46._8_4_;
      auVar149._12_4_ = fVar164 * auVar46._12_4_;
      auVar127 = vfmadd231ps_fma(auVar149,auVar53,auVar127);
      auVar156 = vfmadd231ps_fma(auVar127,auVar136,auVar156);
      auVar127 = vsubps_avx(auVar75,auVar62);
      auVar46._0_4_ = auVar62._0_4_ + auVar75._0_4_;
      auVar46._4_4_ = auVar62._4_4_ + auVar75._4_4_;
      auVar46._8_4_ = auVar62._8_4_ + auVar75._8_4_;
      auVar46._12_4_ = auVar62._12_4_ + auVar75._12_4_;
      auVar62 = vsubps_avx(auVar52,auVar161);
      auVar64._0_4_ = auVar161._0_4_ + auVar52._0_4_;
      auVar64._4_4_ = auVar161._4_4_ + auVar52._4_4_;
      auVar64._8_4_ = auVar161._8_4_ + auVar52._8_4_;
      auVar64._12_4_ = auVar161._12_4_ + auVar52._12_4_;
      auVar161 = vsubps_avx(auVar78,auVar177);
      auVar82._0_4_ = auVar78._0_4_ + auVar177._0_4_;
      auVar82._4_4_ = auVar78._4_4_ + auVar177._4_4_;
      auVar82._8_4_ = auVar78._8_4_ + auVar177._8_4_;
      auVar82._12_4_ = auVar78._12_4_ + auVar177._12_4_;
      auVar113._0_4_ = auVar161._0_4_ * auVar64._0_4_;
      auVar113._4_4_ = auVar161._4_4_ * auVar64._4_4_;
      auVar113._8_4_ = auVar161._8_4_ * auVar64._8_4_;
      auVar113._12_4_ = auVar161._12_4_ * auVar64._12_4_;
      auVar52 = vfmsub231ps_fma(auVar113,auVar62,auVar82);
      auVar83._0_4_ = auVar127._0_4_ * auVar82._0_4_;
      auVar83._4_4_ = auVar127._4_4_ * auVar82._4_4_;
      auVar83._8_4_ = auVar127._8_4_ * auVar82._8_4_;
      auVar83._12_4_ = auVar127._12_4_ * auVar82._12_4_;
      auVar75 = vfmsub231ps_fma(auVar83,auVar161,auVar46);
      auVar78._0_4_ = auVar62._0_4_ * auVar46._0_4_;
      auVar78._4_4_ = auVar62._4_4_ * auVar46._4_4_;
      auVar78._8_4_ = auVar62._8_4_ * auVar46._8_4_;
      auVar78._12_4_ = auVar62._12_4_ * auVar46._12_4_;
      auVar78 = vfmsub231ps_fma(auVar78,auVar127,auVar64);
      auVar47._0_4_ = fVar154 * auVar78._0_4_;
      auVar47._4_4_ = fVar162 * auVar78._4_4_;
      auVar47._8_4_ = fVar163 * auVar78._8_4_;
      auVar47._12_4_ = fVar164 * auVar78._12_4_;
      auVar75 = vfmadd231ps_fma(auVar47,auVar53,auVar75);
      auVar78 = vfmadd231ps_fma(auVar75,auVar136,auVar52);
      auVar140._0_4_ = auVar78._0_4_ + auVar155._0_4_ + auVar156._0_4_;
      auVar140._4_4_ = auVar78._4_4_ + auVar155._4_4_ + auVar156._4_4_;
      auVar140._8_4_ = auVar78._8_4_ + auVar155._8_4_ + auVar156._8_4_;
      auVar140._12_4_ = auVar78._12_4_ + auVar155._12_4_ + auVar156._12_4_;
      auVar75 = vandps_avx(auVar140,auVar100);
      auVar65._0_8_ = CONCAT44(auVar75._4_4_ * 1.1920929e-07,auVar75._0_4_ * 1.1920929e-07);
      auVar65._8_4_ = auVar75._8_4_ * 1.1920929e-07;
      auVar65._12_4_ = auVar75._12_4_ * 1.1920929e-07;
      auVar75 = vminps_avx(auVar155,auVar156);
      auVar75 = vminps_avx(auVar75,auVar78);
      auVar114._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
      auVar114._8_4_ = -auVar65._8_4_;
      auVar114._12_4_ = -auVar65._12_4_;
      auVar75 = vcmpps_avx(auVar75,auVar114,5);
      auVar52 = vmaxps_avx(auVar155,auVar156);
      auVar52 = vmaxps_avx(auVar52,auVar78);
      auVar52 = vcmpps_avx(auVar52,auVar65,2);
      auVar75 = vorps_avx(auVar75,auVar52);
      auVar52 = auVar61 & auVar75;
      auVar75 = vandps_avx(auVar75,auVar61);
      if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar52[0xf] < '\0'
         ) {
        auVar48._0_4_ = fVar169 * auVar44._0_4_;
        auVar48._4_4_ = fVar174 * auVar44._4_4_;
        auVar48._8_4_ = fVar175 * auVar44._8_4_;
        auVar48._12_4_ = fVar176 * auVar44._12_4_;
        auVar66._0_4_ = fVar14 * auVar180._0_4_;
        auVar66._4_4_ = fVar15 * auVar180._4_4_;
        auVar66._8_4_ = fVar16 * auVar180._8_4_;
        auVar66._12_4_ = fVar17 * auVar180._12_4_;
        auVar177 = vfmsub213ps_fma(auVar180,auVar184,auVar48);
        auVar84._0_4_ = auVar62._0_4_ * fVar186;
        auVar84._4_4_ = auVar62._4_4_ * fVar189;
        auVar84._8_4_ = auVar62._8_4_ * fVar190;
        auVar84._12_4_ = auVar62._12_4_ * fVar191;
        auVar115._0_4_ = fVar14 * auVar161._0_4_;
        auVar115._4_4_ = fVar15 * auVar161._4_4_;
        auVar115._8_4_ = fVar16 * auVar161._8_4_;
        auVar115._12_4_ = fVar17 * auVar161._12_4_;
        auVar161 = vfmsub213ps_fma(auVar161,auVar103,auVar84);
        auVar52 = vandps_avx(auVar48,auVar100);
        auVar78 = vandps_avx(auVar84,auVar100);
        auVar52 = vcmpps_avx(auVar52,auVar78,1);
        auVar161 = vblendvps_avx(auVar161,auVar177,auVar52);
        auVar49._0_4_ = auVar127._0_4_ * fVar169;
        auVar49._4_4_ = auVar127._4_4_ * fVar174;
        auVar49._8_4_ = auVar127._8_4_ * fVar175;
        auVar49._12_4_ = auVar127._12_4_ * fVar176;
        auVar177 = vfmsub213ps_fma(auVar127,auVar184,auVar115);
        auVar128._0_4_ = auVar81._0_4_ * fVar186;
        auVar128._4_4_ = auVar81._4_4_ * fVar189;
        auVar128._8_4_ = auVar81._8_4_ * fVar190;
        auVar128._12_4_ = auVar81._12_4_ * fVar191;
        auVar180 = vfmsub213ps_fma(auVar44,auVar104,auVar128);
        auVar52 = vandps_avx(auVar100,auVar128);
        auVar78 = vandps_avx(auVar100,auVar115);
        auVar52 = vcmpps_avx(auVar52,auVar78,1);
        auVar177 = vblendvps_avx(auVar177,auVar180,auVar52);
        auVar180 = vfmsub213ps_fma(auVar81,auVar103,auVar66);
        auVar44 = vfmsub213ps_fma(auVar62,auVar104,auVar49);
        auVar52 = vandps_avx(auVar100,auVar66);
        auVar78 = vandps_avx(auVar100,auVar49);
        auVar52 = vcmpps_avx(auVar52,auVar78,1);
        auVar78 = vblendvps_avx(auVar44,auVar180,auVar52);
        local_19e8 = auVar21._0_4_;
        fStack_19e4 = auVar21._4_4_;
        fStack_19e0 = auVar21._8_4_;
        auVar50._0_4_ = auVar78._0_4_ * local_19e8;
        auVar50._4_4_ = auVar78._4_4_ * fStack_19e4;
        auVar50._8_4_ = auVar78._8_4_ * fStack_19e0;
        auVar50._12_4_ = auVar78._12_4_ * fVar164;
        auVar52 = vfmadd213ps_fma(auVar53,auVar177,auVar50);
        auVar52 = vfmadd213ps_fma(auVar136,auVar161,auVar52);
        auVar51._0_4_ = auVar52._0_4_ + auVar52._0_4_;
        auVar51._4_4_ = auVar52._4_4_ + auVar52._4_4_;
        auVar51._8_4_ = auVar52._8_4_ + auVar52._8_4_;
        auVar51._12_4_ = auVar52._12_4_ + auVar52._12_4_;
        auVar67._0_4_ = auVar78._0_4_ * fVar9;
        auVar67._4_4_ = auVar78._4_4_ * fVar10;
        auVar67._8_4_ = auVar78._8_4_ * fVar11;
        auVar67._12_4_ = auVar78._12_4_ * fVar12;
        auVar52 = vfmadd213ps_fma(auVar165,auVar177,auVar67);
        auVar53 = vfmadd213ps_fma(auVar137,auVar161,auVar52);
        auVar52 = vrcpps_avx(auVar51);
        auVar167._8_4_ = 0x3f800000;
        auVar167._0_8_ = &DAT_3f8000003f800000;
        auVar167._12_4_ = 0x3f800000;
        auVar136 = vfnmadd213ps_fma(auVar52,auVar51,auVar167);
        auVar52 = vfmadd132ps_fma(auVar136,auVar52,auVar52);
        auVar68._0_4_ = auVar52._0_4_ * (auVar53._0_4_ + auVar53._0_4_);
        auVar68._4_4_ = auVar52._4_4_ * (auVar53._4_4_ + auVar53._4_4_);
        auVar68._8_4_ = auVar52._8_4_ * (auVar53._8_4_ + auVar53._8_4_);
        auVar68._12_4_ = auVar52._12_4_ * (auVar53._12_4_ + auVar53._12_4_);
        auVar52 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar68,2);
        auVar53 = vcmpps_avx(auVar68,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar52 = vandps_avx(auVar53,auVar52);
        uVar34 = CONCAT44(auVar51._4_4_,auVar51._0_4_);
        auVar158._0_8_ = uVar34 ^ 0x8000000080000000;
        auVar158._8_4_ = -auVar51._8_4_;
        auVar158._12_4_ = -auVar51._12_4_;
        auVar53 = vcmpps_avx(auVar158,auVar51,4);
        auVar52 = vandps_avx(auVar53,auVar52);
        auVar52 = vpslld_avx(auVar52,0x1f);
        auVar53 = vpsrad_avx(auVar52,0x1f);
        auVar52 = auVar75 & auVar53;
        auVar75 = vandps_avx(auVar53,auVar75);
        if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar52[0xf] < '\0') {
          local_1788 = auVar78;
          local_1778 = auVar177;
          local_1768 = auVar161;
          local_1758 = auVar68;
          local_1748 = auVar140;
          _local_1738 = auVar156;
          _local_1728 = auVar155;
        }
      }
      auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      uVar25 = *(undefined4 *)(local_1ad0 + lVar29);
      auVar187._4_4_ = uVar25;
      auVar187._0_4_ = uVar25;
      auVar187._8_4_ = uVar25;
      auVar187._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(local_1ac8 + lVar29);
      auVar141._4_4_ = uVar25;
      auVar141._0_4_ = uVar25;
      auVar141._8_4_ = uVar25;
      auVar141._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(local_1ac0 + lVar29);
      local_1aa8._4_4_ = uVar25;
      local_1aa8._0_4_ = uVar25;
      local_1aa8._8_4_ = uVar25;
      local_1aa8._12_4_ = uVar25;
      uVar5 = *(uint *)(pre.super_Precalculations.grid + 0x18);
      pGVar7 = (context->scene->geometries).items[uVar5].ptr;
      uVar23 = pGVar7->mask;
      auVar69._4_4_ = uVar23;
      auVar69._0_4_ = uVar23;
      auVar69._8_4_ = uVar23;
      auVar69._12_4_ = uVar23;
      auVar52 = vpand_avx(auVar69,*(undefined1 (*) [16])(ray + 0x90));
      auVar52 = vpcmpeqd_avx(auVar52,_DAT_01feba10);
      auVar78 = auVar75 & ~auVar52;
      auVar53 = local_1aa8;
      if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar78[0xf] < '\0'
         ) {
        uVar25 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
        auVar75 = vandnps_avx(auVar52,auVar75);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar52 = vandps_avx(auVar100,local_1748);
          auVar78 = vrcpps_avx(local_1748);
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = &DAT_3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          auVar53 = vfnmadd213ps_fma(auVar78,local_1748,auVar145);
          auVar78 = vfmadd132ps_fma(auVar53,auVar78,auVar78);
          auVar89._8_4_ = 0x219392ef;
          auVar89._0_8_ = 0x219392ef219392ef;
          auVar89._12_4_ = 0x219392ef;
          auVar52 = vcmpps_avx(auVar52,auVar89,5);
          auVar52 = vandps_avx(auVar52,auVar78);
          auVar76._0_4_ = auVar52._0_4_ * (float)local_1728._0_4_;
          auVar76._4_4_ = auVar52._4_4_ * (float)local_1728._4_4_;
          auVar76._8_4_ = auVar52._8_4_ * fStack_1720;
          auVar76._12_4_ = auVar52._12_4_ * fStack_171c;
          auVar53 = vminps_avx(auVar76,auVar145);
          auVar90._0_4_ = auVar52._0_4_ * (float)local_1738._0_4_;
          auVar90._4_4_ = auVar52._4_4_ * (float)local_1738._4_4_;
          auVar90._8_4_ = auVar52._8_4_ * fStack_1730;
          auVar90._12_4_ = auVar52._12_4_ * fStack_172c;
          auVar136 = vminps_avx(auVar90,auVar145);
          uVar4 = *(undefined4 *)(local_1b30 + lVar29 + -4);
          auVar108._4_4_ = uVar4;
          auVar108._0_4_ = uVar4;
          auVar108._8_4_ = uVar4;
          auVar108._12_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_1ad8 + lVar29);
          auVar119._4_4_ = uVar4;
          auVar119._0_4_ = uVar4;
          auVar119._8_4_ = uVar4;
          auVar119._12_4_ = uVar4;
          auVar78 = vpsrld_avx(auVar108,0x10);
          auVar52 = vpblendw_avx(auVar108,(undefined1  [16])0x0,0xaa);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar137 = vsubps_avx(auVar145,auVar53);
          auVar137 = vsubps_avx(auVar137,auVar136);
          auVar152._0_4_ = auVar137._0_4_ * auVar52._0_4_ * 0.00012207031;
          auVar152._4_4_ = auVar137._4_4_ * auVar52._4_4_ * 0.00012207031;
          auVar152._8_4_ = auVar137._8_4_ * auVar52._8_4_ * 0.00012207031;
          auVar152._12_4_ = auVar137._12_4_ * auVar52._12_4_ * 0.00012207031;
          auVar109._0_4_ = auVar137._0_4_ * auVar78._0_4_ * 0.00012207031;
          auVar109._4_4_ = auVar137._4_4_ * auVar78._4_4_ * 0.00012207031;
          auVar109._8_4_ = auVar137._8_4_ * auVar78._8_4_ * 0.00012207031;
          auVar109._12_4_ = auVar137._12_4_ * auVar78._12_4_ * 0.00012207031;
          auVar52 = vpblendw_avx(auVar119,(undefined1  [16])0x0,0xaa);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar134._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar134._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar134._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar134._12_4_ = auVar52._12_4_ * 0.00012207031;
          auVar78 = vfmadd231ps_fma(auVar152,auVar136,auVar134);
          auVar52 = vpsrld_avx(auVar119,0x10);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar120._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar120._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar120._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar120._12_4_ = auVar52._12_4_ * 0.00012207031;
          auVar136 = vfmadd231ps_fma(auVar109,auVar136,auVar120);
          uVar4 = *(undefined4 *)(local_1b30 + lVar29);
          auVar91._4_4_ = uVar4;
          auVar91._0_4_ = uVar4;
          auVar91._8_4_ = uVar4;
          auVar91._12_4_ = uVar4;
          auVar52 = vpblendw_avx(auVar91,(undefined1  [16])0x0,0xaa);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar121._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar121._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar121._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar121._12_4_ = auVar52._12_4_ * 0.00012207031;
          local_1958 = vfmadd231ps_fma(auVar78,auVar53,auVar121);
          auVar52 = vpsrld_avx(auVar91,0x10);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar92._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar92._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar92._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar92._12_4_ = auVar52._12_4_ * 0.00012207031;
          local_1948 = vfmadd231ps_fma(auVar136,auVar53,auVar92);
          local_1988 = local_1768._0_8_;
          uStack_1980 = local_1768._8_8_;
          local_1978 = local_1778._0_8_;
          uStack_1970 = local_1778._8_8_;
          local_1968 = local_1788._0_8_;
          uStack_1960 = local_1788._8_8_;
          local_1928._4_4_ = uVar5;
          local_1928._0_4_ = uVar5;
          local_1928._8_4_ = uVar5;
          local_1928._12_4_ = uVar5;
          local_1938._4_4_ = uVar25;
          local_1938._0_4_ = uVar25;
          local_1938._8_4_ = uVar25;
          local_1938._12_4_ = uVar25;
          vpcmpeqd_avx2(ZEXT1632(local_1928),ZEXT1632(local_1928));
          uStack_1914 = context->user->instID[0];
          local_1918 = uStack_1914;
          uStack_1910 = uStack_1914;
          uStack_190c = uStack_1914;
          uStack_1908 = context->user->instPrimID[0];
          uStack_1904 = uStack_1908;
          uStack_1900 = uStack_1908;
          uStack_18fc = uStack_1908;
          local_1ab8 = *(undefined1 (*) [16])(ray + 0x80);
          auVar52 = vblendvps_avx(local_1ab8,local_1758,auVar75);
          *(undefined1 (*) [16])(ray + 0x80) = auVar52;
          args.valid = (int *)local_1af8;
          args.geometryUserPtr = pGVar7->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1988;
          args.N = 4;
          local_1af8 = auVar75;
          args.ray = (RTCRayN *)ray;
          auVar75 = local_1938;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar7->occlusionFilterN)(&args);
            auVar179._8_56_ = extraout_var;
            auVar179._0_8_ = extraout_XMM1_Qa;
            auVar52 = auVar179._0_16_;
            auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1af8 == (undefined1  [16])0x0) {
            auVar75 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar52 = vpcmpeqd_avx(auVar52,auVar52);
            auVar75 = auVar75 ^ auVar52;
          }
          else {
            p_Var8 = context->args->filter;
            auVar75 = vpcmpeqd_avx(auVar75,auVar75);
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&args);
              auVar75 = vpcmpeqd_avx(auVar75,auVar75);
              auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar52 = vpcmpeqd_avx((undefined1  [16])0x0,local_1af8);
            auVar75 = auVar52 ^ auVar75;
            auVar93._8_4_ = 0xff800000;
            auVar93._0_8_ = 0xff800000ff800000;
            auVar93._12_4_ = 0xff800000;
            auVar52 = vblendvps_avx(auVar93,*(undefined1 (*) [16])(args.ray + 0x80),auVar52);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar52;
          }
          auVar52 = vpslld_avx(auVar75,0x1f);
          auVar75 = vpsrad_avx(auVar52,0x1f);
          auVar52 = vblendvps_avx(local_1ab8,*(undefined1 (*) [16])pRVar1,auVar52);
          *(undefined1 (*) [16])pRVar1 = auVar52;
          auVar165 = local_1aa8;
          auVar53 = local_1aa8;
        }
        local_1aa8 = auVar165;
        auVar61 = vpandn_avx(auVar75,auVar61);
        auVar165 = local_1aa8;
      }
      local_1aa8 = auVar165;
      auVar179 = ZEXT1664(auVar100);
      auVar194 = ZEXT1664(auVar61);
      if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar61[0xf])
      {
        auVar75 = vpcmpeqd_avx(auVar187,auVar187);
        auVar188 = ZEXT1664(auVar75);
        break;
      }
      auVar75 = *(undefined1 (*) [16])ray;
      auVar52 = *(undefined1 (*) [16])(ray + 0x10);
      auVar78 = *(undefined1 (*) [16])(ray + 0x20);
      local_1ab8 = vsubps_avx(auVar170,auVar75);
      auVar136 = vsubps_avx(auVar102,auVar52);
      auVar137 = vsubps_avx(auVar126,auVar78);
      auVar165 = vsubps_avx(auVar45,auVar75);
      auVar161 = vsubps_avx(auVar63,auVar52);
      auVar177 = vsubps_avx(auVar112,auVar78);
      auVar180 = vsubps_avx(auVar187,auVar75);
      auVar52 = vsubps_avx(auVar141,auVar52);
      auVar78 = vsubps_avx(auVar53,auVar78);
      auVar53 = vsubps_avx(auVar180,local_1ab8);
      auVar44 = vsubps_avx(auVar52,auVar136);
      auVar62 = vsubps_avx(auVar78,auVar137);
      auVar105._0_4_ = auVar180._0_4_ + local_1ab8._0_4_;
      auVar105._4_4_ = auVar180._4_4_ + local_1ab8._4_4_;
      auVar105._8_4_ = auVar180._8_4_ + local_1ab8._8_4_;
      auVar105._12_4_ = auVar180._12_4_ + local_1ab8._12_4_;
      auVar142._0_4_ = auVar136._0_4_ + auVar52._0_4_;
      auVar142._4_4_ = auVar136._4_4_ + auVar52._4_4_;
      auVar142._8_4_ = auVar136._8_4_ + auVar52._8_4_;
      auVar142._12_4_ = auVar136._12_4_ + auVar52._12_4_;
      fVar186 = auVar137._0_4_;
      auVar159._0_4_ = fVar186 + auVar78._0_4_;
      fVar189 = auVar137._4_4_;
      auVar159._4_4_ = fVar189 + auVar78._4_4_;
      fVar190 = auVar137._8_4_;
      auVar159._8_4_ = fVar190 + auVar78._8_4_;
      fVar191 = auVar137._12_4_;
      auVar159._12_4_ = fVar191 + auVar78._12_4_;
      auVar178._0_4_ = auVar142._0_4_ * auVar62._0_4_;
      auVar178._4_4_ = auVar142._4_4_ * auVar62._4_4_;
      auVar178._8_4_ = auVar142._8_4_ * auVar62._8_4_;
      auVar178._12_4_ = auVar142._12_4_ * auVar62._12_4_;
      auVar103 = vfmsub231ps_fma(auVar178,auVar44,auVar159);
      auVar172._0_4_ = auVar159._0_4_ * auVar53._0_4_;
      auVar172._4_4_ = auVar159._4_4_ * auVar53._4_4_;
      auVar172._8_4_ = auVar159._8_4_ * auVar53._8_4_;
      auVar172._12_4_ = auVar159._12_4_ * auVar53._12_4_;
      auVar81 = vfmsub231ps_fma(auVar172,auVar62,auVar105);
      auVar106._0_4_ = auVar105._0_4_ * auVar44._0_4_;
      auVar106._4_4_ = auVar105._4_4_ * auVar44._4_4_;
      auVar106._8_4_ = auVar105._8_4_ * auVar44._8_4_;
      auVar106._12_4_ = auVar105._12_4_ * auVar44._12_4_;
      auVar184 = vfmsub231ps_fma(auVar106,auVar53,auVar142);
      auVar75 = *(undefined1 (*) [16])(ray + 0x60);
      fVar154 = auVar75._0_4_;
      auVar107._0_4_ = fVar154 * auVar184._0_4_;
      fVar162 = auVar75._4_4_;
      auVar107._4_4_ = fVar162 * auVar184._4_4_;
      fVar163 = auVar75._8_4_;
      auVar107._8_4_ = fVar163 * auVar184._8_4_;
      fVar164 = auVar75._12_4_;
      auVar107._12_4_ = fVar164 * auVar184._12_4_;
      local_1aa8 = *(undefined1 (*) [16])(ray + 0x50);
      auVar81 = vfmadd231ps_fma(auVar107,local_1aa8,auVar81);
      auVar75 = *(undefined1 (*) [16])(ray + 0x40);
      auVar104 = vfmadd231ps_fma(auVar81,auVar75,auVar103);
      auVar81 = vsubps_avx(auVar136,auVar161);
      auVar137 = vsubps_avx(auVar137,auVar177);
      auVar143._0_4_ = auVar136._0_4_ + auVar161._0_4_;
      auVar143._4_4_ = auVar136._4_4_ + auVar161._4_4_;
      auVar143._8_4_ = auVar136._8_4_ + auVar161._8_4_;
      auVar143._12_4_ = auVar136._12_4_ + auVar161._12_4_;
      auVar192._0_4_ = fVar186 + auVar177._0_4_;
      auVar192._4_4_ = fVar189 + auVar177._4_4_;
      auVar192._8_4_ = fVar190 + auVar177._8_4_;
      auVar192._12_4_ = fVar191 + auVar177._12_4_;
      fVar169 = auVar137._0_4_;
      auVar129._0_4_ = fVar169 * auVar143._0_4_;
      fVar174 = auVar137._4_4_;
      auVar129._4_4_ = fVar174 * auVar143._4_4_;
      fVar175 = auVar137._8_4_;
      auVar129._8_4_ = fVar175 * auVar143._8_4_;
      fVar176 = auVar137._12_4_;
      auVar129._12_4_ = fVar176 * auVar143._12_4_;
      auVar127 = vfmsub231ps_fma(auVar129,auVar81,auVar192);
      auVar103 = vsubps_avx(local_1ab8,auVar165);
      fVar9 = auVar103._0_4_;
      auVar193._0_4_ = auVar192._0_4_ * fVar9;
      fVar11 = auVar103._4_4_;
      auVar193._4_4_ = auVar192._4_4_ * fVar11;
      fVar14 = auVar103._8_4_;
      auVar193._8_4_ = auVar192._8_4_ * fVar14;
      fVar16 = auVar103._12_4_;
      auVar193._12_4_ = auVar192._12_4_ * fVar16;
      auVar150._0_4_ = auVar165._0_4_ + local_1ab8._0_4_;
      auVar150._4_4_ = auVar165._4_4_ + local_1ab8._4_4_;
      auVar150._8_4_ = auVar165._8_4_ + local_1ab8._8_4_;
      auVar150._12_4_ = auVar165._12_4_ + local_1ab8._12_4_;
      auVar184 = vfmsub231ps_fma(auVar193,auVar137,auVar150);
      fVar10 = auVar81._0_4_;
      auVar151._0_4_ = auVar150._0_4_ * fVar10;
      fVar12 = auVar81._4_4_;
      auVar151._4_4_ = auVar150._4_4_ * fVar12;
      fVar15 = auVar81._8_4_;
      auVar151._8_4_ = auVar150._8_4_ * fVar15;
      fVar17 = auVar81._12_4_;
      auVar151._12_4_ = auVar150._12_4_ * fVar17;
      auVar155 = vfmsub231ps_fma(auVar151,auVar103,auVar143);
      auVar144._0_4_ = fVar154 * auVar155._0_4_;
      auVar144._4_4_ = fVar162 * auVar155._4_4_;
      auVar144._8_4_ = fVar163 * auVar155._8_4_;
      auVar144._12_4_ = fVar164 * auVar155._12_4_;
      auVar184 = vfmadd231ps_fma(auVar144,local_1aa8,auVar184);
      auVar127 = vfmadd231ps_fma(auVar184,auVar75,auVar127);
      auVar184 = vsubps_avx(auVar165,auVar180);
      auVar70._0_4_ = auVar165._0_4_ + auVar180._0_4_;
      auVar70._4_4_ = auVar165._4_4_ + auVar180._4_4_;
      auVar70._8_4_ = auVar165._8_4_ + auVar180._8_4_;
      auVar70._12_4_ = auVar165._12_4_ + auVar180._12_4_;
      auVar165 = vsubps_avx(auVar161,auVar52);
      auVar54._0_4_ = auVar161._0_4_ + auVar52._0_4_;
      auVar54._4_4_ = auVar161._4_4_ + auVar52._4_4_;
      auVar54._8_4_ = auVar161._8_4_ + auVar52._8_4_;
      auVar54._12_4_ = auVar161._12_4_ + auVar52._12_4_;
      auVar161 = vsubps_avx(auVar177,auVar78);
      auVar85._0_4_ = auVar177._0_4_ + auVar78._0_4_;
      auVar85._4_4_ = auVar177._4_4_ + auVar78._4_4_;
      auVar85._8_4_ = auVar177._8_4_ + auVar78._8_4_;
      auVar85._12_4_ = auVar177._12_4_ + auVar78._12_4_;
      auVar116._0_4_ = auVar161._0_4_ * auVar54._0_4_;
      auVar116._4_4_ = auVar161._4_4_ * auVar54._4_4_;
      auVar116._8_4_ = auVar161._8_4_ * auVar54._8_4_;
      auVar116._12_4_ = auVar161._12_4_ * auVar54._12_4_;
      auVar78 = vfmsub231ps_fma(auVar116,auVar165,auVar85);
      auVar86._0_4_ = auVar184._0_4_ * auVar85._0_4_;
      auVar86._4_4_ = auVar184._4_4_ * auVar85._4_4_;
      auVar86._8_4_ = auVar184._8_4_ * auVar85._8_4_;
      auVar86._12_4_ = auVar184._12_4_ * auVar85._12_4_;
      auVar52 = vfmsub231ps_fma(auVar86,auVar161,auVar70);
      auVar71._0_4_ = auVar165._0_4_ * auVar70._0_4_;
      auVar71._4_4_ = auVar165._4_4_ * auVar70._4_4_;
      auVar71._8_4_ = auVar165._8_4_ * auVar70._8_4_;
      auVar71._12_4_ = auVar165._12_4_ * auVar70._12_4_;
      auVar177 = vfmsub231ps_fma(auVar71,auVar184,auVar54);
      auVar55._0_4_ = fVar154 * auVar177._0_4_;
      auVar55._4_4_ = fVar162 * auVar177._4_4_;
      auVar55._8_4_ = fVar163 * auVar177._8_4_;
      auVar55._12_4_ = fVar164 * auVar177._12_4_;
      auVar52 = vfmadd231ps_fma(auVar55,local_1aa8,auVar52);
      auVar177 = vfmadd231ps_fma(auVar52,auVar75,auVar78);
      auVar130._0_4_ = auVar177._0_4_ + auVar104._0_4_ + auVar127._0_4_;
      auVar130._4_4_ = auVar177._4_4_ + auVar104._4_4_ + auVar127._4_4_;
      auVar130._8_4_ = auVar177._8_4_ + auVar104._8_4_ + auVar127._8_4_;
      auVar130._12_4_ = auVar177._12_4_ + auVar104._12_4_ + auVar127._12_4_;
      auVar52 = vandps_avx(auVar130,auVar100);
      auVar72._0_4_ = auVar52._0_4_ * 1.1920929e-07;
      auVar72._4_4_ = auVar52._4_4_ * 1.1920929e-07;
      auVar72._8_4_ = auVar52._8_4_ * 1.1920929e-07;
      auVar72._12_4_ = auVar52._12_4_ * 1.1920929e-07;
      auVar52 = vminps_avx(auVar104,auVar127);
      auVar52 = vminps_avx(auVar52,auVar177);
      uVar34 = CONCAT44(auVar72._4_4_,auVar72._0_4_);
      auVar117._0_8_ = uVar34 ^ 0x8000000080000000;
      auVar117._8_4_ = -auVar72._8_4_;
      auVar117._12_4_ = -auVar72._12_4_;
      auVar52 = vcmpps_avx(auVar52,auVar117,5);
      auVar78 = vmaxps_avx(auVar104,auVar127);
      auVar78 = vmaxps_avx(auVar78,auVar177);
      auVar78 = vcmpps_avx(auVar78,auVar72,2);
      auVar52 = vorps_avx(auVar52,auVar78);
      auVar78 = auVar61 & auVar52;
      auVar52 = vandps_avx(auVar52,auVar61);
      if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar78[0xf] < '\0'
         ) {
        auVar56._0_4_ = fVar10 * auVar62._0_4_;
        auVar56._4_4_ = fVar12 * auVar62._4_4_;
        auVar56._8_4_ = fVar15 * auVar62._8_4_;
        auVar56._12_4_ = fVar17 * auVar62._12_4_;
        local_1a28._4_4_ = fVar11 * auVar44._4_4_;
        local_1a28._0_4_ = fVar9 * auVar44._0_4_;
        fStack_1a20 = fVar14 * auVar44._8_4_;
        fStack_1a1c = fVar16 * auVar44._12_4_;
        auVar177 = vfmsub213ps_fma(auVar44,auVar137,auVar56);
        auVar87._0_4_ = auVar165._0_4_ * fVar169;
        auVar87._4_4_ = auVar165._4_4_ * fVar174;
        auVar87._8_4_ = auVar165._8_4_ * fVar175;
        auVar87._12_4_ = auVar165._12_4_ * fVar176;
        auVar118._0_4_ = fVar9 * auVar161._0_4_;
        auVar118._4_4_ = fVar11 * auVar161._4_4_;
        auVar118._8_4_ = fVar14 * auVar161._8_4_;
        auVar118._12_4_ = fVar16 * auVar161._12_4_;
        auVar180 = vfmsub213ps_fma(auVar161,auVar81,auVar87);
        auVar78 = vandps_avx(auVar100,auVar56);
        auVar161 = vandps_avx(auVar100,auVar87);
        auVar78 = vcmpps_avx(auVar78,auVar161,1);
        auVar177 = vblendvps_avx(auVar180,auVar177,auVar78);
        auVar131._0_4_ = auVar184._0_4_ * fVar10;
        auVar131._4_4_ = auVar184._4_4_ * fVar12;
        auVar131._8_4_ = auVar184._8_4_ * fVar15;
        auVar131._12_4_ = auVar184._12_4_ * fVar17;
        auVar180 = vfmsub213ps_fma(auVar184,auVar137,auVar118);
        auVar88._0_4_ = fVar169 * auVar53._0_4_;
        auVar88._4_4_ = fVar174 * auVar53._4_4_;
        auVar88._8_4_ = fVar175 * auVar53._8_4_;
        auVar88._12_4_ = fVar176 * auVar53._12_4_;
        auVar44 = vfmsub213ps_fma(auVar62,auVar103,auVar88);
        auVar78 = vandps_avx(auVar100,auVar88);
        auVar161 = vandps_avx(auVar100,auVar118);
        auVar78 = vcmpps_avx(auVar78,auVar161,1);
        auVar161 = vblendvps_avx(auVar180,auVar44,auVar78);
        auVar180 = vfmsub213ps_fma(auVar53,auVar81,_local_1a28);
        auVar165 = vfmsub213ps_fma(auVar165,auVar103,auVar131);
        auVar78 = vandps_avx(auVar100,_local_1a28);
        auVar53 = vandps_avx(auVar100,auVar131);
        auVar78 = vcmpps_avx(auVar78,auVar53,1);
        auVar78 = vblendvps_avx(auVar165,auVar180,auVar78);
        auVar73._0_4_ = auVar78._0_4_ * fVar154;
        auVar73._4_4_ = auVar78._4_4_ * fVar162;
        auVar73._8_4_ = auVar78._8_4_ * fVar163;
        auVar73._12_4_ = auVar78._12_4_ * fVar164;
        auVar53 = vfmadd213ps_fma(local_1aa8,auVar161,auVar73);
        auVar75 = vfmadd213ps_fma(auVar75,auVar177,auVar53);
        auVar74._0_4_ = auVar75._0_4_ + auVar75._0_4_;
        auVar74._4_4_ = auVar75._4_4_ + auVar75._4_4_;
        auVar74._8_4_ = auVar75._8_4_ + auVar75._8_4_;
        auVar74._12_4_ = auVar75._12_4_ + auVar75._12_4_;
        auVar132._0_4_ = auVar78._0_4_ * fVar186;
        auVar132._4_4_ = auVar78._4_4_ * fVar189;
        auVar132._8_4_ = auVar78._8_4_ * fVar190;
        auVar132._12_4_ = auVar78._12_4_ * fVar191;
        auVar75 = vfmadd213ps_fma(auVar136,auVar161,auVar132);
        auVar53 = vfmadd213ps_fma(local_1ab8,auVar177,auVar75);
        auVar75 = vrcpps_avx(auVar74);
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = &DAT_3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar136 = vfnmadd213ps_fma(auVar75,auVar74,auVar168);
        auVar75 = vfmadd132ps_fma(auVar136,auVar75,auVar75);
        auVar133._0_4_ = auVar75._0_4_ * (auVar53._0_4_ + auVar53._0_4_);
        auVar133._4_4_ = auVar75._4_4_ * (auVar53._4_4_ + auVar53._4_4_);
        auVar133._8_4_ = auVar75._8_4_ * (auVar53._8_4_ + auVar53._8_4_);
        auVar133._12_4_ = auVar75._12_4_ * (auVar53._12_4_ + auVar53._12_4_);
        auVar75 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar133,2);
        auVar53 = vcmpps_avx(auVar133,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar75 = vandps_avx(auVar53,auVar75);
        uVar34 = CONCAT44(auVar74._4_4_,auVar74._0_4_);
        auVar160._0_8_ = uVar34 ^ 0x8000000080000000;
        auVar160._8_4_ = -auVar74._8_4_;
        auVar160._12_4_ = -auVar74._12_4_;
        auVar53 = vcmpps_avx(auVar160,auVar74,4);
        auVar75 = vandps_avx(auVar53,auVar75);
        auVar75 = vpslld_avx(auVar75,0x1f);
        auVar53 = vpsrad_avx(auVar75,0x1f);
        auVar75 = auVar52 & auVar53;
        auVar52 = vandps_avx(auVar53,auVar52);
        if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar75[0xf] < '\0') {
          local_17f8 = auVar78;
          local_17e8 = auVar161;
          local_17d8 = auVar177;
          local_17c8 = auVar133;
          local_17b8 = auVar130;
          _local_17a8 = auVar127;
          _local_1798 = auVar104;
        }
      }
      auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar78 = vpcmpeqd_avx(auVar137,auVar137);
      auVar188 = ZEXT1664(auVar78);
      uVar5 = *(uint *)(pre.super_Precalculations.grid + 0x18);
      pGVar7 = (context->scene->geometries).items[uVar5].ptr;
      uVar23 = pGVar7->mask;
      auVar57._4_4_ = uVar23;
      auVar57._0_4_ = uVar23;
      auVar57._8_4_ = uVar23;
      auVar57._12_4_ = uVar23;
      auVar75 = vpand_avx(auVar57,*(undefined1 (*) [16])(ray + 0x90));
      auVar75 = vpcmpeqd_avx(auVar75,_DAT_01feba10);
      auVar53 = auVar52 & ~auVar75;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        uVar25 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
        auVar75 = vandnps_avx(auVar75,auVar52);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar52 = vandps_avx(auVar100,local_17b8);
          auVar53 = vrcpps_avx(local_17b8);
          auVar146._8_4_ = 0x3f800000;
          auVar146._0_8_ = &DAT_3f8000003f800000;
          auVar146._12_4_ = 0x3f800000;
          auVar136 = vfnmadd213ps_fma(auVar53,local_17b8,auVar146);
          auVar53 = vfmadd132ps_fma(auVar136,auVar53,auVar53);
          auVar94._8_4_ = 0x219392ef;
          auVar94._0_8_ = 0x219392ef219392ef;
          auVar94._12_4_ = 0x219392ef;
          auVar52 = vcmpps_avx(auVar52,auVar94,5);
          auVar52 = vandps_avx(auVar52,auVar53);
          auVar77._0_4_ = auVar52._0_4_ * (float)local_1798._0_4_;
          auVar77._4_4_ = auVar52._4_4_ * (float)local_1798._4_4_;
          auVar77._8_4_ = auVar52._8_4_ * fStack_1790;
          auVar77._12_4_ = auVar52._12_4_ * fStack_178c;
          auVar136 = vminps_avx(auVar77,auVar146);
          auVar95._0_4_ = auVar52._0_4_ * (float)local_17a8._0_4_;
          auVar95._4_4_ = auVar52._4_4_ * (float)local_17a8._4_4_;
          auVar95._8_4_ = auVar52._8_4_ * fStack_17a0;
          auVar95._12_4_ = auVar52._12_4_ * fStack_179c;
          auVar137 = vminps_avx(auVar95,auVar146);
          uVar4 = *(undefined4 *)(local_1ad8 + lVar29);
          auVar110._4_4_ = uVar4;
          auVar110._0_4_ = uVar4;
          auVar110._8_4_ = uVar4;
          auVar110._12_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_1ad8 + lVar29 + 4);
          auVar122._4_4_ = uVar4;
          auVar122._0_4_ = uVar4;
          auVar122._8_4_ = uVar4;
          auVar122._12_4_ = uVar4;
          auVar53 = vpsrld_avx(auVar110,0x10);
          auVar161 = ZEXT816(0) << 0x40;
          auVar52 = vpblendw_avx(auVar110,auVar161,0xaa);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar53 = vcvtdq2ps_avx(auVar53);
          auVar165 = vsubps_avx(auVar146,auVar136);
          auVar165 = vsubps_avx(auVar165,auVar137);
          auVar153._0_4_ = auVar165._0_4_ * auVar52._0_4_ * 0.00012207031;
          auVar153._4_4_ = auVar165._4_4_ * auVar52._4_4_ * 0.00012207031;
          auVar153._8_4_ = auVar165._8_4_ * auVar52._8_4_ * 0.00012207031;
          auVar153._12_4_ = auVar165._12_4_ * auVar52._12_4_ * 0.00012207031;
          auVar111._0_4_ = auVar165._0_4_ * auVar53._0_4_ * 0.00012207031;
          auVar111._4_4_ = auVar165._4_4_ * auVar53._4_4_ * 0.00012207031;
          auVar111._8_4_ = auVar165._8_4_ * auVar53._8_4_ * 0.00012207031;
          auVar111._12_4_ = auVar165._12_4_ * auVar53._12_4_ * 0.00012207031;
          auVar52 = vpblendw_avx(auVar122,auVar161,0xaa);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar135._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar135._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar135._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar135._12_4_ = auVar52._12_4_ * 0.00012207031;
          auVar53 = vfmadd231ps_fma(auVar153,auVar137,auVar135);
          auVar52 = vpsrld_avx(auVar122,0x10);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar123._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar123._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar123._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar123._12_4_ = auVar52._12_4_ * 0.00012207031;
          auVar137 = vfmadd231ps_fma(auVar111,auVar137,auVar123);
          uVar4 = *(undefined4 *)(local_1b30 + lVar29);
          auVar96._4_4_ = uVar4;
          auVar96._0_4_ = uVar4;
          auVar96._8_4_ = uVar4;
          auVar96._12_4_ = uVar4;
          auVar52 = vpblendw_avx(auVar96,auVar161,0xaa);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar124._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar124._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar124._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar124._12_4_ = auVar52._12_4_ * 0.00012207031;
          local_1958 = vfmadd231ps_fma(auVar53,auVar136,auVar124);
          auVar52 = vpsrld_avx(auVar96,0x10);
          auVar52 = vcvtdq2ps_avx(auVar52);
          auVar97._0_4_ = auVar52._0_4_ * 0.00012207031;
          auVar97._4_4_ = auVar52._4_4_ * 0.00012207031;
          auVar97._8_4_ = auVar52._8_4_ * 0.00012207031;
          auVar97._12_4_ = auVar52._12_4_ * 0.00012207031;
          local_1948 = vfmadd231ps_fma(auVar137,auVar136,auVar97);
          local_1988 = local_17d8._0_8_;
          uStack_1980 = local_17d8._8_8_;
          local_1978 = local_17e8._0_8_;
          uStack_1970 = local_17e8._8_8_;
          local_1968 = local_17f8._0_8_;
          uStack_1960 = local_17f8._8_8_;
          local_1928._4_4_ = uVar5;
          local_1928._0_4_ = uVar5;
          local_1928._8_4_ = uVar5;
          local_1928._12_4_ = uVar5;
          local_1938._4_4_ = uVar25;
          local_1938._0_4_ = uVar25;
          local_1938._8_4_ = uVar25;
          local_1938._12_4_ = uVar25;
          vpcmpeqd_avx2(ZEXT1632(local_1928),ZEXT1632(local_1928));
          uStack_1914 = context->user->instID[0];
          local_1918 = uStack_1914;
          uStack_1910 = uStack_1914;
          uStack_190c = uStack_1914;
          uStack_1908 = context->user->instPrimID[0];
          uStack_1904 = uStack_1908;
          uStack_1900 = uStack_1908;
          uStack_18fc = uStack_1908;
          auVar52 = *(undefined1 (*) [16])(ray + 0x80);
          auVar53 = vblendvps_avx(auVar52,local_17c8,auVar75);
          *(undefined1 (*) [16])(ray + 0x80) = auVar53;
          args.valid = (int *)local_1af8;
          args.geometryUserPtr = pGVar7->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1988;
          args.N = 4;
          local_1af8 = auVar75;
          args.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar7->occlusionFilterN)(&args);
            auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1af8 == (undefined1  [16])0x0) {
            auVar75 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar78 = vpcmpeqd_avx(auVar78,auVar78);
            auVar188 = ZEXT1664(auVar78);
            auVar78 = auVar78 ^ auVar75;
          }
          else {
            p_Var8 = context->args->filter;
            auVar75 = vpcmpeqd_avx(auVar78,auVar78);
            auVar188 = ZEXT1664(auVar75);
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&args);
              auVar75 = vpcmpeqd_avx(auVar75,auVar75);
              auVar188 = ZEXT1664(auVar75);
              auVar185 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar173 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar183 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar75 = vpcmpeqd_avx((undefined1  [16])0x0,local_1af8);
            auVar78 = auVar188._0_16_ ^ auVar75;
            auVar98._8_4_ = 0xff800000;
            auVar98._0_8_ = 0xff800000ff800000;
            auVar98._12_4_ = 0xff800000;
            auVar75 = vblendvps_avx(auVar98,*(undefined1 (*) [16])(args.ray + 0x80),auVar75);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar75;
          }
          auVar78 = vpslld_avx(auVar78,0x1f);
          auVar75 = vpsrad_avx(auVar78,0x1f);
          auVar52 = vblendvps_avx(auVar52,*(undefined1 (*) [16])pRVar1,auVar78);
          *(undefined1 (*) [16])pRVar1 = auVar52;
        }
        auVar61 = vpandn_avx(auVar75,auVar61);
      }
      auVar179 = ZEXT1664(auVar100);
      auVar194 = ZEXT1664(auVar61);
      lVar29 = lVar29 + 4;
    } while ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar61[0xf] < '\0');
    if (iVar24 == 2) break;
  }
  sVar27 = 0;
  auVar100 = auVar188._0_16_ ^ auVar194._0_16_;
LAB_0054eb4d:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx(auVar100,(undefined1  [16])terminated.field_0);
  auVar100 = auVar188._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar100[0xf]) {
LAB_0054ebb2:
    iVar24 = 3;
  }
  else {
    auVar99._8_4_ = 0xff800000;
    auVar99._0_8_ = 0xff800000ff800000;
    auVar99._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar99,
                       (undefined1  [16])terminated.field_0);
    iVar24 = 0;
    if (sVar27 != 0) {
      pNVar35->ptr = sVar27;
      pNVar35 = pNVar35 + 1;
      aVar58.i[2] = 0xff800000;
      aVar58._0_8_ = 0xff800000ff800000;
      aVar58.i[3] = 0xff800000;
      *paVar32 = aVar58;
      paVar32 = paVar32 + 1;
    }
  }
LAB_0054ebb5:
  if (iVar24 == 3) {
    auVar13 = vandps_avx(auVar79,(undefined1  [16])terminated.field_0);
    auVar79._8_4_ = 0xff800000;
    auVar79._0_8_ = 0xff800000ff800000;
    auVar79._12_4_ = 0xff800000;
    auVar13 = vmaskmovps_avx(auVar13,auVar79);
    *(undefined1 (*) [16])pRVar1 = auVar13;
    return;
  }
  goto LAB_0054d724;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }